

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexReader::MetaData::getValue<short>
          (MetaData *this,int index,MetaDataType requestedType,short **value,int *count)

{
  uint uVar1;
  Entry *pEVar2;
  
  if ((-1 < index) &&
     (index < (int)((ulong)((long)(this->_entries).
                                  super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_entries).
                                 super__Vector_base<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
    pEVar2 = getEntry(this,index);
    if ((pEVar2 != (Entry *)0x0) && (pEVar2->type == requestedType)) {
      *value = (short *)pEVar2->data;
      uVar1 = pEVar2->datasize >> 1;
      goto LAB_005e0e8a;
    }
  }
  *value = (short *)0x0;
  uVar1 = 0;
LAB_005e0e8a:
  *count = uVar1;
  return;
}

Assistant:

void getValue(int index, MetaDataType requestedType, const T*& value, int& count)
        {
	    if (index < 0 || index >= int(_entries.size())) {
                value = 0;
                count = 0;
                return;
            }
	    Entry* e = getEntry(index);
	    if (e && e->type == requestedType) {
	        value = (const T*) e->data;
	        count = int(e->datasize/sizeof(T));
	    }
	    else { value = 0; count = 0; }
        }